

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestReportResults::Run(TestReportResults *this)

{
  pointer outputter;
  iterator iVar1;
  iterator iVar2;
  difference_type dVar3;
  size_type sVar4;
  bool local_1769;
  difference_type numFailed;
  difference_type total;
  difference_type numPassed;
  size_t sStack_1700;
  unsigned_long local_16f8;
  undefined1 local_16f0 [8];
  Results rs;
  string local_16d0 [32];
  undefined1 local_16b0 [8];
  TestReportResultsInternal test1;
  string local_1660 [32];
  undefined1 local_1640 [8];
  TestReportResultsInternal test0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15d8 [8];
  ostringstream oss;
  undefined1 local_1460 [8];
  TestRegistry r;
  TestReportResults *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &test0.m_fail);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f0,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)&test0.m_fail);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)&test0.m_fail);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1660,"expected_fail",(allocator *)&test1.field_0x47);
  TestReportResultsInternal::TestReportResultsInternal
            ((TestReportResultsInternal *)local_1640,(TestRegistry *)local_1460,(string *)local_1660
             ,true);
  std::__cxx11::string::~string(local_1660);
  std::allocator<char>::~allocator((allocator<char> *)&test1.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_16d0,"expected_pass",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestReportResultsInternal::TestReportResultsInternal
            ((TestReportResultsInternal *)local_16b0,(TestRegistry *)local_1460,(string *)local_16d0
             ,false);
  std::__cxx11::string::~string(local_16d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  numPassed = 0;
  sStack_1700 = 0;
  local_16f8 = 0;
  testinator::RunParams::RunParams((RunParams *)&numPassed);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f0);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_16f0,(TestRegistry *)local_1460,(RunParams *)&numPassed,outputter);
  iVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::begin
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_16f0);
  iVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::end
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_16f0);
  dVar3 = std::
          count_if<__gnu_cxx::__normal_iterator<testinator::Result*,std::vector<testinator::Result,std::allocator<testinator::Result>>>,TestReportResults::Run()::_lambda(testinator::Result_const&)_1_>
                    (iVar1._M_current,iVar2._M_current);
  sVar4 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::size
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_16f0);
  local_1769 = dVar3 == 1 && sVar4 - dVar3 == 1;
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_16f0);
  TestReportResultsInternal::~TestReportResultsInternal((TestReportResultsInternal *)local_16b0);
  TestReportResultsInternal::~TestReportResultsInternal((TestReportResultsInternal *)local_1640);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f0);
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1460);
  return local_1769;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestReportResultsInternal test0(r, "expected_fail", true);
    TestReportResultsInternal test1(r, "expected_pass", false);
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());
    auto numPassed = count_if(rs.begin(), rs.end(),
                              [] (const testinator::Result& res)
                              { return res.m_success; });
    auto total = decltype(numPassed)(rs.size());
    auto numFailed = total - numPassed;
    return numPassed == 1 && numFailed == 1;
  }